

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::(anonymous_namespace)::BasicAllTargetsStore::WriteCubeArray<tcu::Vector<int,4>>
          (BasicAllTargetsStore *this,GLenum internalformat,Vector<int,_4> *write_value,
          Vector<int,_4> *expected_value)

{
  byte bVar1;
  bool bVar2;
  GLuint GVar3;
  GLenum GVar4;
  GLenum type;
  GLenum GVar5;
  char *src_fs;
  reference pvVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  Vector<int,_4> local_118;
  string local_108;
  Vector<int,_4> local_e8;
  string local_d8;
  int local_b4;
  int i;
  __normal_iterator<tcu::Vector<int,_4>_*,_std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>_>
  local_a0;
  __normal_iterator<tcu::Vector<int,_4>_*,_std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>_>
  local_98;
  byte local_8a;
  allocator<tcu::Vector<int,_4>_> local_89;
  undefined1 local_88 [6];
  bool status;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> data;
  GLuint local_68;
  int kSize;
  GLuint textures [1];
  string local_58;
  GLuint local_34;
  char *pcStack_30;
  GLuint program;
  char *src_vs;
  Vector<int,_4> *expected_value_local;
  Vector<int,_4> *write_value_local;
  BasicAllTargetsStore *pBStack_10;
  GLenum internalformat_local;
  BasicAllTargetsStore *this_local;
  
  pcStack_30 = 
  "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
  ;
  src_vs = (char *)expected_value;
  expected_value_local = write_value;
  write_value_local._4_4_ = internalformat;
  pBStack_10 = this;
  GenFSCubeArray<tcu::Vector<int,4>>(&local_58,this,internalformat,write_value);
  src_fs = (char *)std::__cxx11::string::c_str();
  GVar3 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                    ((ShaderImageLoadStoreBase *)this,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,src_fs,(bool *)0x0);
  std::__cxx11::string::~string((string *)&local_58);
  local_34 = GVar3;
  glu::CallLogWrapper::glGenTextures((CallLogWrapper *)(this + 8),1,&local_68);
  data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0x10;
  std::allocator<tcu::Vector<int,_4>_>::allocator(&local_89);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_88,0xc00,
             &local_89);
  std::allocator<tcu::Vector<int,_4>_>::~allocator(&local_89);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x9009,local_68);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x9009,0x2801,0x2601);
  GVar5 = write_value_local._4_4_;
  GVar4 = ShaderImageLoadStoreBase::Format<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  type = ShaderImageLoadStoreBase::Type<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  pvVar6 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                     ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_88
                      ,0);
  glu::CallLogWrapper::glTexImage3D
            ((CallLogWrapper *)(this + 8),0x9009,0,GVar5,0x10,0x10,0xc,0,GVar4,type,pvVar6);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x9009,0);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),0,local_68,0,'\x01',0,0x88b9,write_value_local._4_4_);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),local_34);
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)(this + 8),*(GLuint *)(this + 0x28));
  glu::CallLogWrapper::glViewport((CallLogWrapper *)(this + 8),0,0,0x10,0x10);
  glu::CallLogWrapper::glDrawArrays((CallLogWrapper *)(this + 8),5,0,4);
  local_8a = 1;
  local_98._M_current =
       (Vector<int,_4> *)
       std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::begin
                 ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_88);
  local_a0._M_current =
       (Vector<int,_4> *)
       std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::end
                 ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_88);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&stack0xffffffffffffff50,0);
  std::
  fill<__gnu_cxx::__normal_iterator<tcu::Vector<int,4>*,std::vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>>>,tcu::Vector<int,4>>
            (local_98,local_a0,(Vector<int,_4> *)&stack0xffffffffffffff50);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x9009,local_68);
  glu::CallLogWrapper::glMemoryBarrier((CallLogWrapper *)(this + 8),0x100);
  GVar5 = ShaderImageLoadStoreBase::Format<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  GVar4 = ShaderImageLoadStoreBase::Type<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  pvVar6 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                     ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_88
                      ,0);
  glu::CallLogWrapper::glGetTexImage((CallLogWrapper *)(this + 8),0x9009,0,GVar5,GVar4,pvVar6);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x9009,0);
  local_b4 = 0;
  do {
    if (0xbff < local_b4) {
LAB_0105e21b:
      glu::CallLogWrapper::glDeleteTextures((CallLogWrapper *)(this + 8),1,&local_68);
      glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),0);
      glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),local_34);
      bVar1 = local_8a;
      std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~vector
                ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_88);
      return (bool)(bVar1 & 1);
    }
    pvVar6 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                       ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                        local_88,(long)local_b4);
    bVar2 = tcu::allEqual<int,4>(pvVar6,(Vector<int,_4> *)src_vs);
    if (!bVar2) {
      local_8a = 0;
      pvVar6 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                         ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                          local_88,(long)local_b4);
      tcu::Vector<int,_4>::Vector(&local_e8,pvVar6);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>
                (&local_d8,(ShaderImageLoadStoreBase *)this,&local_e8);
      uVar7 = std::__cxx11::string::c_str();
      tcu::Vector<int,_4>::Vector(&local_118,(Vector<int,_4> *)src_vs);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>
                (&local_108,(ShaderImageLoadStoreBase *)this,&local_118);
      uVar8 = std::__cxx11::string::c_str();
      gl4cts::anon_unknown_0::Output
                ("GL_TEXTURE_CUBE_MAP_ARRAY target failed. Value is: %s. Value should be: %s.\n",
                 uVar7,uVar8);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_d8);
      goto LAB_0105e21b;
    }
    local_b4 = local_b4 + 1;
  } while( true );
}

Assistant:

bool WriteCubeArray(GLenum internalformat, const T& write_value, const T& expected_value)
	{
		const char* src_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL
							 "  gl_Position = i_position;" NL "}";
		const GLuint program =
			BuildProgram(src_vs, NULL, NULL, NULL, GenFSCubeArray(internalformat, write_value).c_str());
		GLuint textures[1];
		glGenTextures(1, textures);

		const int kSize = 16;

		std::vector<T> data(kSize * kSize * 12);
		glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, textures[0]);
		glTexParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, internalformat, kSize, kSize, 12, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, 0);

		glBindImageTexture(0, textures[0], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);

		glUseProgram(program);
		glBindVertexArray(m_vao);
		glViewport(0, 0, kSize, kSize);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		bool status = true;

		std::fill(data.begin(), data.end(), T(0));
		glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, textures[0]);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glGetTexImage(GL_TEXTURE_CUBE_MAP_ARRAY, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, 0);
		for (int i = 0; i < kSize * kSize * 12; ++i)
		{
			if (!tcu::allEqual(data[i], expected_value))
			{
				status = false;
				Output("GL_TEXTURE_CUBE_MAP_ARRAY target failed. Value is: %s. Value should be: %s.\n",
					   ToString(data[i]).c_str(), ToString(expected_value).c_str());
				break;
			}
		}

		glDeleteTextures(1, textures);
		glUseProgram(0);
		glDeleteProgram(program);

		return status;
	}